

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void Int2StrConvert<unsigned_int>(void)

{
  long lVar1;
  ostream *poVar2;
  uint x;
  char local_78 [8];
  char buf [64];
  ResultType _result;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  poVar2 = std::operator<<(poVar2,___gxx_personality_v0 + (*___gxx_personality_v0 == '*'));
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"int2str::convert");
  std::operator<<(poVar2,"... ");
  std::ostream::flush();
  _result.__r = (rep)(buf + 0x38);
  std::chrono::_V2::steady_clock::now();
  x = 0;
  while (x + 1 != 0) {
    int2str::convert_with_zero<unsigned_int,char*>(x,local_78);
    x = x + 1;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&_result);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>((double)buf._56_8_);
  poVar2 = std::operator<<(poVar2,"s");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Int2StrConvert()
{
#ifdef _MSC_VER  
    static char buf[64];
#else
    char buf[64];
#endif
    PROFILING_BEGIN(T, "int2str::convert")
    int2str::convert_with_zero(i, buf);
    PROFILING_END()
}